

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_delay.c
# Opt level: O1

void * sigdelread_new(t_symbol *s,t_floatarg f)

{
  t_sigdelread *x;
  
  x = (t_sigdelread *)pd_new(sigdelread_class);
  x->x_sym = s;
  x->x_sr = 1.0;
  x->x_n = 1.0;
  x->x_zerodel = 0;
  sigdelread_float(x,f);
  outlet_new((t_object *)x,&s_signal);
  return x;
}

Assistant:

static void *sigdelread_new(t_symbol *s, t_floatarg f)
{
    t_sigdelread *x = (t_sigdelread *)pd_new(sigdelread_class);
    x->x_sym = s;
    x->x_sr = 1;
    x->x_n = 1;
    x->x_zerodel = 0;
    sigdelread_float(x, f);
    outlet_new(&x->x_obj, &s_signal);
    return (x);
}